

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001cff80 = 0x2e2e2e2e2e2e2e;
    uRam00000000001cff87._0_1_ = '.';
    uRam00000000001cff87._1_1_ = '.';
    uRam00000000001cff87._2_1_ = '.';
    uRam00000000001cff87._3_1_ = '.';
    uRam00000000001cff87._4_1_ = '.';
    uRam00000000001cff87._5_1_ = '.';
    uRam00000000001cff87._6_1_ = '.';
    uRam00000000001cff87._7_1_ = '.';
    DAT_001cff70 = '.';
    DAT_001cff70_1._0_1_ = '.';
    DAT_001cff70_1._1_1_ = '.';
    DAT_001cff70_1._2_1_ = '.';
    DAT_001cff70_1._3_1_ = '.';
    DAT_001cff70_1._4_1_ = '.';
    DAT_001cff70_1._5_1_ = '.';
    DAT_001cff70_1._6_1_ = '.';
    uRam00000000001cff78 = 0x2e2e2e2e2e2e2e;
    DAT_001cff7f = 0x2e;
    DAT_001cff60 = '.';
    DAT_001cff60_1._0_1_ = '.';
    DAT_001cff60_1._1_1_ = '.';
    DAT_001cff60_1._2_1_ = '.';
    DAT_001cff60_1._3_1_ = '.';
    DAT_001cff60_1._4_1_ = '.';
    DAT_001cff60_1._5_1_ = '.';
    DAT_001cff60_1._6_1_ = '.';
    uRam00000000001cff68._0_1_ = '.';
    uRam00000000001cff68._1_1_ = '.';
    uRam00000000001cff68._2_1_ = '.';
    uRam00000000001cff68._3_1_ = '.';
    uRam00000000001cff68._4_1_ = '.';
    uRam00000000001cff68._5_1_ = '.';
    uRam00000000001cff68._6_1_ = '.';
    uRam00000000001cff68._7_1_ = '.';
    DAT_001cff50 = '.';
    DAT_001cff50_1._0_1_ = '.';
    DAT_001cff50_1._1_1_ = '.';
    DAT_001cff50_1._2_1_ = '.';
    DAT_001cff50_1._3_1_ = '.';
    DAT_001cff50_1._4_1_ = '.';
    DAT_001cff50_1._5_1_ = '.';
    DAT_001cff50_1._6_1_ = '.';
    uRam00000000001cff58._0_1_ = '.';
    uRam00000000001cff58._1_1_ = '.';
    uRam00000000001cff58._2_1_ = '.';
    uRam00000000001cff58._3_1_ = '.';
    uRam00000000001cff58._4_1_ = '.';
    uRam00000000001cff58._5_1_ = '.';
    uRam00000000001cff58._6_1_ = '.';
    uRam00000000001cff58._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001cff48._0_1_ = '.';
    uRam00000000001cff48._1_1_ = '.';
    uRam00000000001cff48._2_1_ = '.';
    uRam00000000001cff48._3_1_ = '.';
    uRam00000000001cff48._4_1_ = '.';
    uRam00000000001cff48._5_1_ = '.';
    uRam00000000001cff48._6_1_ = '.';
    uRam00000000001cff48._7_1_ = '.';
    DAT_001cff8f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}